

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::reactive_socket_service
          (reactive_socket_service<asio::ip::tcp> *this,execution_context *context)

{
  execution_context *in_RDI;
  reactive_socket_service_base *in_stack_ffffffffffffffe0;
  
  execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>::
  execution_context_service_base
            ((execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
              *)in_stack_ffffffffffffffe0,in_RDI);
  reactive_socket_service_base::reactive_socket_service_base(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->service_registry_ = (service_registry *)&PTR__reactive_socket_service_0054ad30;
  return;
}

Assistant:

reactive_socket_service(execution_context& context)
    : execution_context_service_base<
        reactive_socket_service<Protocol> >(context),
      reactive_socket_service_base(context)
  {
  }